

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void __thiscall cs_impl::runtime_cs_ext::fiber_callable::operator()(fiber_callable *this)

{
  lang_error *le;
  exception *e;
  instance_type *in_stack_ffffffffffffff90;
  function *in_stack_ffffffffffffff98;
  
  cs::function::call(in_stack_ffffffffffffff98,(vector *)in_stack_ffffffffffffff90);
  any::~any((any *)0x2cae01);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::clear
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x2cae0f);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cae1c);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cae28);
  cs::instance_type::clear_context(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void operator()() const noexcept
			{
				try {
					func->call(args);
					args.clear();
					context->instance->clear_context();
				}
				catch (const lang_error &le) {
					std::cerr << "coroutine terminated after throwing an instance of runtime exception" << std::endl;
					std::cerr << "what(): " << le.what() << std::endl;
				}
				catch (const std::exception &e) {
					std::cerr << "coroutine terminated after throwing an instance of exception" << std::endl;
					std::cerr << "what(): " << e.what() << std::endl;
				}
				catch (...) {
					std::cerr << "coroutine terminated after throwing an instance of unknown exception" << std::endl;
				}
			}